

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O1

void MiscGetEnvArray(void)

{
  palEnvironment = _environ;
  return;
}

Assistant:

void
MiscGetEnvArray(void)
{
#if HAVE__NSGETENVIRON
    palEnvironment = *(_NSGetEnviron());
#else   // HAVE__NSGETENVIRON
    extern char **environ;
    palEnvironment = environ;
#endif  // HAVE__NSGETENVIRON
}